

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ParserResult * __thiscall Catch::Clara::Detail::BoundFlagRef::setFlag(BoundFlagRef *this,bool flag)

{
  byte in_DL;
  long in_RSI;
  ParserResult *in_RDI;
  ParseResultType *in_stack_ffffffffffffffd8;
  
  **(byte **)(in_RSI + 8) = in_DL & 1;
  BasicResult<Catch::Clara::ParseResultType>::ok<Catch::Clara::ParseResultType>
            (in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

ParserResult BoundFlagRef::setFlag( bool flag ) {
                m_ref = flag;
                return ParserResult::ok( ParseResultType::Matched );
            }